

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

iterator __thiscall
QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::lowerBound
          (QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *this,int *key)

{
  QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
  *pQVar1;
  _Base_ptr p_Var2;
  iterator iVar3;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_20.d.ptr ==
       (QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
           *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_20.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_*>
          )(QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
       *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
                        *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pQVar1 = (this->d).d.ptr;
  p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  iVar3._M_node = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (*key <= (int)p_Var2[1]._M_color) {
        iVar3._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < *key];
    } while (p_Var2 != (_Base_ptr)0x0);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (iterator)(iterator)iVar3._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator lowerBound(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.lower_bound(key));
    }